

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O3

bool __thiscall QHostAddress::setAddress(QHostAddress *this,QString *address)

{
  bool bVar1;
  QHostAddressPrivate *this_00;
  
  this_00 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QExplicitlySharedDataPointer<QHostAddressPrivate>::detach_helper(&this->d);
    this_00 = (this->d).d.ptr;
  }
  bVar1 = QHostAddressPrivate::parse(this_00,address);
  return bVar1;
}

Assistant:

bool QHostAddress::setAddress(const QString &address)
{
    d.detach();
    return d->parse(address);
}